

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O0

void device_reset_c6280mame(void *chip)

{
  undefined2 *puVar1;
  t_channel *TempChn;
  UINT8 CurChn;
  c6280_t *info;
  void *chip_local;
  
  *(undefined1 *)((long)chip + 8) = 0;
  *(undefined1 *)((long)chip + 9) = 0;
  *(undefined1 *)((long)chip + 10) = 0;
  *(undefined1 *)((long)chip + 0xb) = 0;
  for (TempChn._7_1_ = 0; TempChn._7_1_ < 6; TempChn._7_1_ = TempChn._7_1_ + 1) {
    puVar1 = (undefined2 *)((long)chip + (ulong)TempChn._7_1_ * 0x38 + 0xc);
    *puVar1 = 0;
    *(undefined1 *)(puVar1 + 1) = 0;
    *(undefined1 *)((long)puVar1 + 3) = 0;
    memset(puVar1 + 2,0,0x20);
    *(undefined1 *)(puVar1 + 0x12) = 0;
    puVar1[0x13] = 0;
    *(undefined1 *)(puVar1 + 0x14) = 0;
    *(undefined4 *)(puVar1 + 0x16) = 0;
    *(undefined4 *)(puVar1 + 0x18) = 0;
  }
  return;
}

Assistant:

static void device_reset_c6280mame(void* chip)
{
	c6280_t *info = (c6280_t *)chip;
	UINT8 CurChn;
	t_channel* TempChn;
	
	info->select = 0x00;
	info->balance = 0x00;
	info->lfo_frequency = 0x00;
	info->lfo_control = 0x00;
	
	for (CurChn = 0; CurChn < 6; CurChn ++)
	{
		TempChn = &info->channel[CurChn];
		
		TempChn->frequency = 0x00;
		TempChn->control = 0x00;
		TempChn->balance = 0x00;
		memset(TempChn->waveform, 0x00, 0x20);
		TempChn->index = 0x00;
		TempChn->dda = 0x00;
		TempChn->noise_control = 0x00;
		TempChn->noise_counter = 0x00;
		TempChn->counter = 0x00;
	}
	
	return;
}